

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_19f77d::countZeros(UChar *patternString,int32_t patternLength)

{
  int local_1c;
  int local_18;
  int32_t i;
  int32_t numZeros;
  int32_t patternLength_local;
  UChar *patternString_local;
  
  local_18 = 0;
  local_1c = 0;
  do {
    if (patternLength <= local_1c) {
      return local_18;
    }
    if (patternString[local_1c] == L'0') {
      local_18 = local_18 + 1;
    }
    else if (0 < local_18) {
      return local_18;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int32_t countZeros(const UChar *patternString, int32_t patternLength) {
    // NOTE: This strategy for computing the number of zeros is a hack for efficiency.
    // It could break if there are any 0s that aren't part of the main pattern.
    int32_t numZeros = 0;
    for (int32_t i = 0; i < patternLength; i++) {
        if (patternString[i] == u'0') {
            numZeros++;
        } else if (numZeros > 0) {
            break; // zeros should always be contiguous
        }
    }
    return numZeros;
}